

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

void elf_writesections(GlobalVars *gv,FILE *f)

{
  FILE *in_RSI;
  long in_RDI;
  LinkedSection *ls;
  long *plVar1;
  
  for (plVar1 = *(long **)(in_RDI + 0x1d8); *plVar1 != 0; plVar1 = (long *)*plVar1) {
    if (((*(byte *)((long)plVar1 + 0x21) & 1) != 0) && ((*(byte *)((long)plVar1 + 0x21) & 2) == 0))
    {
      fwritex(in_RSI,plVar1,0x128ab5);
    }
  }
  for (plVar1 = *(long **)(in_RDI + 0x1d8); *plVar1 != 0; plVar1 = (long *)*plVar1) {
    if (((*(byte *)((long)plVar1 + 0x21) & 1) == 0) && ((*(byte *)((long)plVar1 + 0x21) & 2) == 0))
    {
      fwritex(in_RSI,plVar1,0x128b1d);
    }
  }
  return;
}

Assistant:

void elf_writesections(struct GlobalVars *gv,FILE *f)
/* write all linked sections */
{
  struct LinkedSection *ls;

  /* write all allocated sections */
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (ls->flags & SF_ALLOC) {
      if (!(ls->flags & SF_UNINITIALIZED))
        fwritex(f,ls->data,ls->size);
    }
  }
  /* unallocated sections at last */
  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    if (!(ls->flags & SF_ALLOC)) {
      if (!(ls->flags & SF_UNINITIALIZED))
        fwritex(f,ls->data,ls->size);
    }
  }
}